

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile-time-extended-kalman-filter.hxx
# Opt level: O2

StateVector * __thiscall
stateObservation::compileTime::ExtendedKalmanFilter<4U,_3U,_1U>::prediction_
          (StateVector *__return_storage_ptr__,ExtendedKalmanFilter<4U,_3U,_1U> *this,uint k)

{
  State *this_00;
  State *this_01;
  DynamicsFunctorBase *pDVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  reference this_02;
  InputVector u;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  MatrixT local_58;
  
  this_02 = std::
            _Deque_iterator<stateObservation::compileTime::IndexedMatrix<1U,_1U>,_stateObservation::compileTime::IndexedMatrix<1U,_1U>_&,_stateObservation::compileTime::IndexedMatrix<1U,_1U>_*>
            ::operator[](&(this->super_KalmanFilterBase<4U,_3U,_1U>).
                          super_ZeroDelayObserver<4U,_3U,_1U>.u_.
                          super__Deque_base<stateObservation::compileTime::IndexedMatrix<1U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<1U,_1U>_>_>
                          ._M_impl.super__Deque_impl_data._M_start,0);
  IndexedMatrix<1U,_1U>::check_(this_02);
  u.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
       (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)
       (this_02->v_).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
       array[0];
  this_01 = &this->xbar_;
  if ((this->xbar_).isSet_ == true) {
    IndexedMatrix<4U,_1U>::check_(this_01);
    if ((this->xbar_).k_ == k) goto LAB_00145697;
  }
  pDVar1 = this->f_;
  if (pDVar1 == (DynamicsFunctorBase *)0x0) {
    __assert_fail("f_!=0x0 && \"ERROR: The Kalman filter functor is not set\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-extended-kalman-filter.hxx"
                  ,0x23,
                  "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::ExtendedKalmanFilter<4, 3, 1>::prediction_(unsigned int) [n = 4, m = 3, p = 1]"
                 );
  }
  this_00 = &(this->super_KalmanFilterBase<4U,_3U,_1U>).super_ZeroDelayObserver<4U,_3U,_1U>.x_;
  IndexedMatrix<4U,_1U>::check_(this_00);
  local_78 = (this->super_KalmanFilterBase<4U,_3U,_1U>).super_ZeroDelayObserver<4U,_3U,_1U>.x_.v_.
             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
  dStack_70 = (this->super_KalmanFilterBase<4U,_3U,_1U>).super_ZeroDelayObserver<4U,_3U,_1U>.x_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
  ;
  local_68 = (this->super_KalmanFilterBase<4U,_3U,_1U>).super_ZeroDelayObserver<4U,_3U,_1U>.x_.v_.
             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
  dStack_60 = (this->super_KalmanFilterBase<4U,_3U,_1U>).super_ZeroDelayObserver<4U,_3U,_1U>.x_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
  ;
  IndexedMatrix<4U,_1U>::check_(this_00);
  (**pDVar1->_vptr_DynamicsFunctorBase)
            (&local_58,pDVar1,&local_78,&u,
             (ulong)(this->super_KalmanFilterBase<4U,_3U,_1U>).super_ZeroDelayObserver<4U,_3U,_1U>.
                    x_.k_);
  IndexedMatrix<4U,_1U>::set(this_01,&local_58,k);
LAB_00145697:
  IndexedMatrix<4U,_1U>::check_(this_01);
  dVar2 = (this->xbar_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array[0];
  dVar3 = (this->xbar_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array[1];
  dVar4 = (this->xbar_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array[3];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[2] =
       (this->xbar_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[2];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[3] = dVar4;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[0] = dVar2;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[1] = dVar3;
  return __return_storage_ptr__;
}

Assistant:

typename ObserverBase<n,m,p>::StateVector ExtendedKalmanFilter<n,m,p>::prediction_(unsigned k)
{
    typename ObserverBase<n,m,p>::InputVector u;

    if (p>0)
        u=this->u_[0]();


    if (!this->xbar_.isSet() || this->xbar_.getTime()!=k)
    {
        BOOST_ASSERT (f_!=0x0 && "ERROR: The Kalman filter functor is not set");
        xbar_.set(f_->stateDynamics(
                      this->x_(),
                      u,
                      this->x_.getTime()),
                  k);
    }
    return xbar_();
}